

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O0

void crn_set_memory_callbacks(crn_realloc_func pRealloc,crn_msize_func pMSize,void *pUser_data)

{
  void *pUser_data_local;
  crn_msize_func pMSize_local;
  crn_realloc_func pRealloc_local;
  
  if ((pRealloc == (crn_realloc_func)0x0) ||
     (crnlib::g_pRealloc = pRealloc, crnlib::g_pMSize = pMSize, crnlib::g_pUser_data = pUser_data,
     pMSize == (crn_msize_func)0x0)) {
    crnlib::g_pRealloc = crnlib::crnlib_default_realloc;
    crnlib::g_pMSize = crnlib::crnlib_default_msize;
    crnlib::g_pUser_data = (void *)0x0;
  }
  return;
}

Assistant:

void crn_set_memory_callbacks(crn_realloc_func pRealloc, crn_msize_func pMSize, void* pUser_data) {
  if ((!pRealloc) || (!pMSize)) {
    crnlib::g_pRealloc = crnlib::crnlib_default_realloc;
    crnlib::g_pMSize = crnlib::crnlib_default_msize;
    crnlib::g_pUser_data = NULL;
  } else {
    crnlib::g_pRealloc = pRealloc;
    crnlib::g_pMSize = pMSize;
    crnlib::g_pUser_data = pUser_data;
  }
}